

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

void __thiscall MIDIplay::applySetup(MIDIplay *this)

{
  uint uVar1;
  byte local_93;
  byte local_92;
  byte local_91;
  AdlChannel local_78;
  BankEntry *local_20;
  BankEntry *b;
  Synth *synth;
  MIDIplay *this_local;
  
  synth = (Synth *)this;
  b = (BankEntry *)AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator*(&this->m_synth);
  ((OPL3 *)b)->m_musicMode = MODE_MIDI;
  (this->m_setup).tick_skip_samples_delay = 0;
  ((OPL3 *)b)->m_runAtPcmRate = (bool)((this->m_setup).runAtPcmRate & 1);
  if (((OPL3 *)b)->m_embeddedBank != 0xffffffff) {
    local_20 = g_embeddedBanks + (this->m_setup).bankId;
    (((OPL3 *)b)->m_insBankSetup).volumeModel = local_20->bankSetup & 0xff;
    (((OPL3 *)b)->m_insBankSetup).deepTremolo = ((int)(uint)local_20->bankSetup >> 8 & 1U) != 0;
    (((OPL3 *)b)->m_insBankSetup).deepVibrato = ((int)(uint)local_20->bankSetup >> 8 & 2U) != 0;
    (((OPL3 *)b)->m_insBankSetup).mt32defaults = ((int)(uint)local_20->bankSetup >> 8 & 4U) != 0;
  }
  if ((this->m_setup).deepTremoloMode < 0) {
    local_91 = (((OPL3 *)b)->m_insBankSetup).deepTremolo;
  }
  else {
    local_91 = (this->m_setup).deepTremoloMode != 0;
  }
  ((OPL3 *)b)->m_deepTremoloMode = (bool)(local_91 & 1);
  if ((this->m_setup).deepVibratoMode < 0) {
    local_92 = (((OPL3 *)b)->m_insBankSetup).deepVibrato;
  }
  else {
    local_92 = (this->m_setup).deepVibratoMode != 0;
  }
  ((OPL3 *)b)->m_deepVibratoMode = (bool)(local_92 & 1);
  if ((this->m_setup).scaleModulators < 0) {
    local_93 = (((OPL3 *)b)->m_insBankSetup).scaleModulators;
  }
  else {
    local_93 = (this->m_setup).scaleModulators != 0;
  }
  ((OPL3 *)b)->m_scaleModulators = (bool)(local_93 & 1);
  if (((this->m_setup).logarithmicVolumes & 1U) == 0) {
    ::OPL3::setVolumeScaleModel((OPL3 *)b,(this->m_setup).volumeScaleModel);
  }
  else {
    ::OPL3::setVolumeScaleModel((OPL3 *)b,ADLMIDI_VolumeModel_CMF);
  }
  if ((this->m_setup).volumeScaleModel == 0) {
    *(undefined4 *)((long)&b[0xe].title + 2) = *(undefined4 *)((long)&b[0xc].title + 2);
  }
  *(uint *)&b[0xc].banksOffsetPercussive = (this->m_setup).numChips;
  this->m_cmfPercussionMode = false;
  if ((this->m_setup).numFourOps < 0) {
    adlCalculateFourOpChannels(this,true);
  }
  else {
    *(int *)&b[0xd].title = (this->m_setup).numFourOps;
  }
  chipReset(this);
  std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::clear
            (&this->m_chipChannels);
  uVar1._0_2_ = b->bankSetup;
  uVar1._2_2_ = b->banksMelodicCount;
  AdlChannel::AdlChannel(&local_78);
  std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::resize
            (&this->m_chipChannels,(ulong)uVar1,&local_78);
  AdlChannel::~AdlChannel(&local_78);
  this->m_arpeggioCounter = 0;
  return;
}

Assistant:

void MIDIplay::applySetup()
{
    Synth &synth = *m_synth;

    synth.m_musicMode = Synth::MODE_MIDI;
    m_setup.tick_skip_samples_delay = 0;
    synth.m_runAtPcmRate = m_setup.runAtPcmRate;

#ifndef DISABLE_EMBEDDED_BANKS
    if(synth.m_embeddedBank != Synth::CustomBankTag)
    {
        const BanksDump::BankEntry &b = g_embeddedBanks[m_setup.bankId];
        synth.m_insBankSetup.volumeModel = (b.bankSetup & 0x00FF);
        synth.m_insBankSetup.deepTremolo = (b.bankSetup >> 8 & 0x0001) != 0;
        synth.m_insBankSetup.deepVibrato = (b.bankSetup >> 8 & 0x0002) != 0;
        synth.m_insBankSetup.mt32defaults = (b.bankSetup >> 8 & 0x0004) != 0;
    }
#endif

    synth.m_deepTremoloMode = m_setup.deepTremoloMode < 0 ?
                              synth.m_insBankSetup.deepTremolo :
                              (m_setup.deepTremoloMode != 0);
    synth.m_deepVibratoMode = m_setup.deepVibratoMode < 0 ?
                              synth.m_insBankSetup.deepVibrato :
                              (m_setup.deepVibratoMode != 0);
    synth.m_scaleModulators = m_setup.scaleModulators < 0 ?
                              synth.m_insBankSetup.scaleModulators :
                              (m_setup.scaleModulators != 0);

    if(m_setup.logarithmicVolumes)
        synth.setVolumeScaleModel(ADLMIDI_VolumeModel_NativeOPL3);
    else
        synth.setVolumeScaleModel(static_cast<ADLMIDI_VolumeModels>(m_setup.volumeScaleModel));

    if(m_setup.volumeScaleModel == ADLMIDI_VolumeModel_AUTO)//Use bank default volume model
        synth.m_volumeScale = (Synth::VolumesScale)synth.m_insBankSetup.volumeModel;

    synth.m_numChips    = m_setup.numChips;
    m_cmfPercussionMode = false;

    if(m_setup.numFourOps >= 0)
        synth.m_numFourOps  = m_setup.numFourOps;
    else
        adlCalculateFourOpChannels(this, true);

    chipReset();
    m_chipChannels.clear();
    m_chipChannels.resize(synth.m_numChannels);

    // Reset the arpeggio counter
    m_arpeggioCounter = 0;
}